

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnnbitset * rnn_findbitset(rnndb *db,char *name)

{
  rnnbitset *prVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)db->bitsetsnum;
  if (db->bitsetsnum < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      return (rnnbitset *)0x0;
    }
    prVar1 = db->bitsets[uVar4];
    iVar2 = strcmp(prVar1->name,name);
    uVar4 = uVar4 + 1;
  } while (iVar2 != 0);
  return prVar1;
}

Assistant:

struct rnnbitset *rnn_findbitset (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->bitsetsnum; i++)
		if (!strcmp(db->bitsets[i]->name, name))
			return db->bitsets[i];
	return 0;
}